

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void caldate_t::now(int32_t *dayno,int32_t *daytime)

{
  int *in_RSI;
  int *in_RDI;
  long ns;
  time_t s;
  undefined8 local_20;
  undefined8 local_18;
  
  os_time_ns((time_t *)s,(long *)ns);
  *in_RDI = (int)(local_18 / 0x15180) + 0xafa6c;
  *in_RSI = (int)(local_18 % 0x15180) * 1000 + (int)(local_20 / 1000000);
  return;
}

Assistant:

void caldate_t::now(int32_t &dayno, int32_t &daytime)
{
    /* get the current date and time in Unix Epoch format */
    os_time_t s;
    long ns;
    os_time_ns(&s, &ns);

    /* 
     *   's' is the number of seconds since the Unix Epoch, 1/1/1970 UTC.
     *   Get our day number: divide by seconds per day to get days past the
     *   Unix Epoch, then adjust to our Epoch (3/1/0000 UTC) by adding the
     *   number of days from our Epoch to the Unix Epoch. 
     */
    dayno = (int32_t)(s/(24*60*60) + caldate_t::UNIX_EPOCH_DAYNO);

    /* 
     *   convert 's' to the time of day, adding in the fractional portion
     *   from 'ns' but only keeping millisecond precision 
     */
    daytime = (uint32_t)((s % (24*60*60))*1000 + ns/1000000);
}